

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O3

bool duckdb::EnumToVarcharCast<unsigned_char>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  data_ptr_t pdVar1;
  byte *pbVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  sel_t *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  undefined8 uVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  Vector *pVVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  _Head_base<0UL,_unsigned_long_*,_false> _Var14;
  idx_t iVar15;
  idx_t iVar16;
  data_ptr_t pdVar17;
  data_ptr_t pdVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t idx_in_entry;
  ulong uVar22;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  buffer_ptr<ValidityBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pVVar12 = EnumType::GetValuesInsertOrder(&source->type);
  pdVar1 = pVVar12->data;
  if (source->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar17 = result->data;
    pdVar4 = source->data;
    FlatVector::VerifyFlatVector(source);
    FlatVector::VerifyFlatVector(result);
    puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar3 == (unsigned_long *)0x0) {
      if (count != 0) {
        pdVar17 = pdVar17 + 8;
        iVar15 = 0;
        do {
          uVar8 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[iVar15] * 0x10 + 8);
          *(undefined8 *)(pdVar17 + -8) = *(undefined8 *)(pdVar1 + (ulong)pdVar4[iVar15] * 0x10);
          *(undefined8 *)pdVar17 = uVar8;
          iVar15 = iVar15 + 1;
          pdVar17 = pdVar17 + 0x10;
        } while (count != iVar15);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar3;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(source->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (source->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar19 = 0;
        uVar22 = 0;
        do {
          if (puVar3 == (unsigned_long *)0x0) {
            uVar20 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar20 = count;
            }
LAB_012bccbd:
            uVar11 = uVar19;
            if (uVar19 < uVar20) {
              pdVar18 = pdVar17 + uVar19 * 0x10 + 8;
              do {
                uVar8 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar19] * 0x10 + 8);
                *(undefined8 *)(pdVar18 + -8) =
                     *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar19] * 0x10);
                *(undefined8 *)pdVar18 = uVar8;
                uVar19 = uVar19 + 1;
                pdVar18 = pdVar18 + 0x10;
                uVar11 = uVar20;
              } while (uVar20 != uVar19);
            }
          }
          else {
            uVar5 = puVar3[uVar22];
            uVar20 = uVar19 + 0x40;
            if (count <= uVar19 + 0x40) {
              uVar20 = count;
            }
            uVar11 = uVar20;
            if (uVar5 != 0) {
              if (uVar5 == 0xffffffffffffffff) goto LAB_012bccbd;
              uVar11 = uVar19;
              if (uVar19 < uVar20) {
                pdVar18 = pdVar17 + uVar19 * 0x10 + 8;
                uVar21 = 0;
                do {
                  if ((uVar5 >> (uVar21 & 0x3f) & 1) != 0) {
                    uVar8 = *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar21 + uVar19] * 0x10 + 8);
                    *(undefined8 *)(pdVar18 + -8) =
                         *(undefined8 *)(pdVar1 + (ulong)pdVar4[uVar21 + uVar19] * 0x10);
                    *(undefined8 *)pdVar18 = uVar8;
                  }
                  uVar21 = uVar21 + 1;
                  pdVar18 = pdVar18 + 0x10;
                  uVar11 = uVar20;
                } while (uVar20 - uVar19 != uVar21);
              }
            }
          }
          uVar19 = uVar11;
          uVar22 = uVar22 + 1;
        } while (uVar22 != count + 0x3f >> 6);
      }
    }
  }
  else if (source->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar17 = result->data;
    pbVar2 = source->data;
    puVar3 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      uVar8 = *(undefined8 *)(pdVar1 + (ulong)*pbVar2 * 0x10 + 8);
      *(undefined8 *)pdVar17 = *(undefined8 *)(pdVar1 + (ulong)*pbVar2 * 0x10);
      *(undefined8 *)(pdVar17 + 8) = uVar8;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(source,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar17 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar6 = (local_78.sel)->sel_vector;
        pdVar17 = pdVar17 + 8;
        iVar15 = 0;
        do {
          iVar16 = iVar15;
          if (psVar6 != (sel_t *)0x0) {
            iVar16 = (idx_t)psVar6[iVar15];
          }
          uVar8 = *(undefined8 *)(pdVar1 + (ulong)local_78.data[iVar16] * 0x10 + 8);
          *(undefined8 *)(pdVar17 + -8) =
               *(undefined8 *)(pdVar1 + (ulong)local_78.data[iVar16] * 0x10);
          *(undefined8 *)pdVar17 = uVar8;
          iVar15 = iVar15 + 1;
          pdVar17 = pdVar17 + 0x10;
        } while (count != iVar15);
      }
    }
    else if (count != 0) {
      psVar6 = (local_78.sel)->sel_vector;
      local_88 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      pdVar17 = pdVar17 + 8;
      uVar22 = 0;
      do {
        uVar19 = uVar22;
        if (psVar6 != (sel_t *)0x0) {
          uVar19 = (ulong)psVar6[uVar22];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar19 >> 6]
             >> (uVar19 & 0x3f) & 1) == 0) {
          _Var14._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var14._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_98,&local_80);
            p_Var10 = p_Stack_90;
            peVar9 = local_98;
            local_98 = (element_type *)0x0;
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_88);
            _Var14._M_head_impl =
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var14._M_head_impl;
          }
          bVar7 = (byte)uVar22 & 0x3f;
          _Var14._M_head_impl[uVar22 >> 6] =
               _Var14._M_head_impl[uVar22 >> 6] &
               (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
        }
        else {
          uVar8 = *(undefined8 *)(pdVar1 + (ulong)local_78.data[uVar19] * 0x10 + 8);
          *(undefined8 *)(pdVar17 + -8) =
               *(undefined8 *)(pdVar1 + (ulong)local_78.data[uVar19] * 0x10);
          *(undefined8 *)pdVar17 = uVar8;
        }
        uVar22 = uVar22 + 1;
        pdVar17 = pdVar17 + 0x10;
      } while (count != uVar22);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return true;
}

Assistant:

static bool EnumToVarcharCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &enum_dictionary = EnumType::GetValuesInsertOrder(source.GetType());
	auto dictionary_data = FlatVector::GetData<string_t>(enum_dictionary);

	UnaryExecutor::Execute<SRC, string_t>(source, result, count,
	                                      [&](SRC enum_idx) { return dictionary_data[enum_idx]; });
	return true;
}